

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InlinePass::AddBranchCond
          (InlinePass *this,uint32_t cond_id,uint32_t true_id,uint32_t false_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *this_00;
  IRContext *c;
  pointer this_01;
  Operand *local_1b8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1b0
  ;
  allocator<spvtools::opt::Operand> local_1a5;
  uint32_t local_1a4;
  iterator local_1a0;
  undefined8 local_198;
  SmallVector<unsigned_int,_2UL> local_190;
  uint32_t local_164;
  iterator local_160;
  undefined8 local_158;
  SmallVector<unsigned_int,_2UL> local_150;
  uint32_t local_124;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  Operand local_e8;
  Operand OStack_b8;
  Operand OStack_88;
  iterator local_58;
  _func_int **local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> newBranch
  ;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *block_ptr_local;
  uint32_t false_id_local;
  uint32_t true_id_local;
  uint32_t cond_id_local;
  InlinePass *this_local;
  
  newBranch._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )block_ptr;
  this_00 = (Instruction *)operator_new(0x70);
  c = Pass::context(&this->super_Pass);
  local_120 = &local_124;
  local_118 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_120;
  local_124 = cond_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_01);
  Operand::Operand(&local_e8,SPV_OPERAND_TYPE_ID,&local_110);
  local_160 = &local_164;
  local_158 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_160;
  local_164 = true_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_00);
  Operand::Operand(&OStack_b8,SPV_OPERAND_TYPE_ID,&local_150);
  local_1a0 = &local_1a4;
  local_198 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_1a0;
  local_1a4 = false_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_190,init_list);
  Operand::Operand(&OStack_88,SPV_OPERAND_TYPE_ID,&local_190);
  local_58 = &local_e8;
  local_50 = (_func_int **)0x3;
  std::allocator<spvtools::opt::Operand>::allocator(&local_1a5);
  __l._M_len = (size_type)local_50;
  __l._M_array = local_58;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_48,__l,&local_1a5);
  Instruction::Instruction(this_00,c,OpBranchConditional,0,0,&local_48);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30,this_00);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_1a5);
  local_1b8 = (Operand *)&local_58;
  do {
    local_1b8 = local_1b8 + -1;
    Operand::~Operand(local_1b8);
  } while (local_1b8 != &local_e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_190);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
  this_01 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)newBranch._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  unique_ptr(&local_1b0,&local_30);
  BasicBlock::AddInstruction(this_01,&local_1b0);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_1b0);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return;
}

Assistant:

void InlinePass::AddBranchCond(uint32_t cond_id, uint32_t true_id,
                               uint32_t false_id,
                               std::unique_ptr<BasicBlock>* block_ptr) {
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranchConditional, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {cond_id}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {true_id}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {false_id}}}));
  (*block_ptr)->AddInstruction(std::move(newBranch));
}